

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data;
  FILE *whereto;
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  long lVar4;
  timediff_t tVar5;
  long seconds;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  curl_off_t cVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  curltime cVar17;
  curltime newer;
  curltime older;
  curltime older_00;
  long local_b0;
  long local_a8;
  long local_a0;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  iVar12 = (data->progress).speeder_c;
  lVar11 = (data->progress).downloaded;
  lVar7 = (data->progress).uploaded;
  cVar17 = Curl_now();
  lVar4 = cVar17.tv_sec;
  uVar2 = (data->progress).start.tv_sec;
  uVar3 = (data->progress).start.tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  auVar1 = cVar17._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  older._12_4_ = 0;
  tVar5 = Curl_timediff_us(newer,older);
  (data->progress).timespent = tVar5;
  seconds = tVar5 / 1000000;
  lVar10 = 999999;
  lVar14 = seconds;
  if (lVar11 < 0x20c49ba5e353f7) {
    lVar10 = 999;
    lVar11 = lVar11 * 1000;
    lVar14 = tVar5 / 1000;
  }
  if (tVar5 <= lVar10) {
    lVar14 = 1;
  }
  lVar16 = 999999;
  lVar10 = seconds;
  if (lVar7 < 0x20c49ba5e353f7) {
    lVar16 = 999;
    lVar7 = lVar7 * 1000;
    lVar10 = tVar5 / 1000;
  }
  if (tVar5 <= lVar16) {
    lVar10 = 1;
  }
  (data->progress).dlspeed = lVar11 / lVar14;
  (data->progress).ulspeed = lVar7 / lVar10;
  lVar16 = (data->progress).lastshow;
  if (lVar16 != lVar4) {
    iVar12 = iVar12 % 6;
    (data->progress).lastshow = lVar4;
    (data->progress).speeder[iVar12] = (data->progress).uploaded + (data->progress).downloaded;
    (data->progress).speeder_time[iVar12].tv_sec = lVar4;
    (data->progress).speeder_time[iVar12].tv_usec = cVar17.tv_usec;
    iVar15 = (data->progress).speeder_c;
    (data->progress).speeder_c = iVar15 + 1U;
    if (iVar15 == 0) {
      lVar11 = lVar11 / lVar14 + lVar7 / lVar10;
    }
    else {
      uVar8 = (ulong)(iVar15 + 1U) % 6;
      if (iVar15 < 5) {
        uVar8 = 0;
      }
      uVar6 = (ulong)(uint)((int)uVar8 << 4);
      cVar17._12_4_ = 0;
      cVar17.tv_sec = auVar1._0_8_;
      cVar17.tv_usec = auVar1._8_4_;
      older_00.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar6);
      older_00.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar6);
      older_00._12_4_ = 0;
      tVar5 = Curl_timediff(cVar17,older_00);
      lVar11 = tVar5 + (ulong)(tVar5 == 0);
      lVar7 = (data->progress).speeder[iVar12] - (data->progress).speeder[uVar8];
      if (lVar7 < 0x418938) {
        lVar11 = (lVar7 * 1000) / lVar11;
      }
      else {
        lVar11 = (long)((double)lVar7 / ((double)lVar11 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar11;
  }
  uVar13 = (data->progress).flags;
  if ((uVar13 & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo != (curl_xferinfo_callback)0x0) {
    Curl_set_in_callback(data,true);
    iVar12 = (*(data->set).fxferinfo)
                       ((data->set).progress_client,(data->progress).size_dl,
                        (data->progress).downloaded,(data->progress).size_ul,
                        (data->progress).uploaded);
LAB_0010c073:
    Curl_set_in_callback(data,false);
    iVar15 = 0;
    if (iVar12 != 0) {
      Curl_failf(data,"Callback aborted");
      iVar15 = iVar12;
    }
    return iVar15;
  }
  if ((data->set).fprogress != (curl_progress_callback)0x0) {
    Curl_set_in_callback(data,true);
    iVar12 = (*(data->set).fprogress)
                       ((data->set).progress_client,(double)(data->progress).size_dl,
                        (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                        (double)(data->progress).uploaded);
    goto LAB_0010c073;
  }
  if (lVar16 == lVar4) {
    return 0;
  }
  if (-1 < (char)uVar13) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar13 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar13;
  }
  if (((uVar13 & 0x20) == 0) || (lVar11 = (data->progress).ulspeed, lVar11 < 1)) {
    local_b0 = 0;
    lVar11 = 0;
  }
  else {
    uVar8 = (data->progress).size_ul;
    lVar11 = (long)uVar8 / lVar11;
    if ((long)uVar8 < 0x2711) {
      if ((long)uVar8 < 1) {
        local_b0 = 0;
        goto LAB_0010c176;
      }
      cVar9 = (data->progress).uploaded * 100;
    }
    else {
      cVar9 = (data->progress).uploaded;
      uVar8 = uVar8 / 100;
    }
    local_b0 = cVar9 / (long)uVar8;
  }
LAB_0010c176:
  if (((uVar13 & 0x40) == 0) || (lVar7 = (data->progress).dlspeed, lVar7 < 1)) {
    local_a8 = 0;
    lVar7 = 0;
  }
  else {
    uVar8 = (data->progress).size_dl;
    lVar7 = (long)uVar8 / lVar7;
    if ((long)uVar8 < 0x2711) {
      if ((long)uVar8 < 1) {
        local_a8 = 0;
        goto LAB_0010c1e3;
      }
      cVar9 = (data->progress).downloaded * 100;
    }
    else {
      cVar9 = (data->progress).downloaded;
      uVar8 = uVar8 / 100;
    }
    local_a8 = cVar9 / (long)uVar8;
  }
LAB_0010c1e3:
  if (lVar7 < lVar11) {
    lVar7 = lVar11;
  }
  cVar9 = 0;
  if (0 < lVar7) {
    cVar9 = lVar7 - seconds;
  }
  time2str(time_left,cVar9);
  time2str(time_total,lVar7);
  time2str(time_spent,seconds);
  uVar13 = (data->progress).flags;
  uVar8 = (&(data->progress).size_dl)[(ulong)((uVar13 & 0x40) == 0) * 2] +
          (&(data->progress).size_ul)[(ulong)((uVar13 & 0x20) == 0) * 2];
  local_a0 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar8 < 0x2711) {
    if ((long)uVar8 < 1) {
      local_a0 = 0;
    }
    else {
      local_a0 = (local_a0 * 100) / (long)uVar8;
    }
  }
  else {
    local_a0 = local_a0 / (long)(uVar8 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar8,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",local_a0,max5 + 2,local_a8
                ,max5,local_b0,max5 + 1,max5 + 3,max5 + 4,time_total,time_spent,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct curltime now;
  curl_off_t timespent;
  curl_off_t timespent_ms; /* milliseconds */
  struct Curl_easy *data = conn->data;
  int nowindex = data->progress.speeder_c% CURR_TIME;
  bool shownow = FALSE;
  curl_off_t dl = data->progress.downloaded;
  curl_off_t ul = data->progress.uploaded;

  now = Curl_now(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent = Curl_timediff_us(now, data->progress.start);
  timespent = (curl_off_t)data->progress.timespent/1000000; /* seconds */
  timespent_ms = (curl_off_t)data->progress.timespent/1000; /* ms */

  /* The average download speed this far */
  if(dl < CURL_OFF_T_MAX/1000)
    data->progress.dlspeed = (dl * 1000 / (timespent_ms>0?timespent_ms:1));
  else
    data->progress.dlspeed = (dl / (timespent>0?timespent:1));

  /* The average upload speed this far */
  if(ul < CURL_OFF_T_MAX/1000)
    data->progress.ulspeed = (ul * 1000 / (timespent_ms>0?timespent_ms:1));
  else
    data->progress.ulspeed = (ul / (timespent>0?timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded + data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c >= CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c >= CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now,
                              data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the average */
      data->progress.current_speed =
        data->progress.ulspeed + data->progress.dlspeed;

  } /* Calculations end */

  if(!(data->progress.flags & PGRS_HIDE)) {
    /* progress meter has not been shut off */
    char max5[6][10];
    curl_off_t dlpercen = 0;
    curl_off_t ulpercen = 0;
    curl_off_t total_percen = 0;
    curl_off_t total_transfer;
    curl_off_t total_expected_transfer;
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    curl_off_t ulestimate = 0;
    curl_off_t dlestimate = 0;
    curl_off_t total_estimate;

    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }

    if(!shownow)
      /* only show the internal progress meter once per second */
      return 0;

    /* If there's no external callback set, use internal code to show
       progress */

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      (data->progress.flags & PGRS_UL_SIZE_KNOWN?
       data->progress.size_ul:data->progress.uploaded)+
      (data->progress.flags & PGRS_DL_SIZE_KNOWN?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5]) /* current speed */
            );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);

  } /* !(data->progress.flags & PGRS_HIDE) */

  return 0;
}